

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respondent.c
# Opt level: O0

int nn_respondent_send(nn_sockbase *self,nn_msg *msg)

{
  FILE *__stream;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  nn_sockbase *local_38;
  nn_respondent *respondent;
  int rc;
  nn_msg *msg_local;
  nn_sockbase *self_local;
  
  local_38 = self;
  if (self == (nn_sockbase *)0x0) {
    local_38 = (nn_sockbase *)0x0;
  }
  if (((ulong)local_38[0x1b].vfptr & 1) == 0) {
    self_local._4_4_ = -0x9523dfe;
  }
  else {
    sVar2 = nn_chunkref_size(&msg->sphdr);
    if (sVar2 != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/survey/respondent.c"
              ,0x78);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_chunkref_term(&msg->sphdr);
    nn_chunkref_mv(&msg->sphdr,(nn_chunkref *)&local_38[0x1b].sock);
    *(uint *)&local_38[0x1b].vfptr = *(uint *)&local_38[0x1b].vfptr & 0xfffffffe;
    iVar1 = nn_xrespondent_send(local_38,msg);
    __stream = _stderr;
    if (iVar1 != 0 && iVar1 != -0xb) {
      pcVar3 = nn_err_strerror(-iVar1);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/survey/respondent.c"
              ,0x82);
      fflush(_stderr);
      nn_err_abort();
    }
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

static int nn_respondent_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_respondent *respondent;

    respondent = nn_cont (self, struct nn_respondent, xrespondent.sockbase);

    /*  If there's no survey going on, report EFSM error. */
    if (nn_slow (!(respondent->flags & NN_RESPONDENT_INPROGRESS)))
        return -EFSM;

    /*  Tag the message with survey ID. */
    nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_mv (&msg->sphdr, &respondent->backtrace);

    /*  Remember that no survey is being processed. */
    respondent->flags &= ~NN_RESPONDENT_INPROGRESS;

    /*  Try to send the message. If it cannot be sent due to pushback, drop it
        silently. */
    rc = nn_xrespondent_send (&respondent->xrespondent.sockbase, msg);
    errnum_assert (rc == 0 || rc == -EAGAIN, -rc);

    return 0;
}